

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainwindow.cpp
# Opt level: O0

void __thiscall
FSSMainWindow::onCurrentChanged(FSSMainWindow *this,QModelIndex *current,QModelIndex *param_2)

{
  bool bVar1;
  int iVar2;
  QModelIndex local_58;
  QModelIndex local_40;
  uint local_28;
  Resource local_24;
  uint index;
  Resource resource_class;
  QModelIndex *param_2_local;
  QModelIndex *current_local;
  FSSMainWindow *this_local;
  
  local_24 = AssetNone;
  local_28 = 0;
  _index = param_2;
  param_2_local = current;
  current_local = (QModelIndex *)this;
  QModelIndex::parent(&local_40,current);
  bVar1 = QModelIndex::isValid(&local_40);
  if (bVar1) {
    QModelIndex::parent(&local_58,param_2_local);
    iVar2 = QModelIndex::row(&local_58);
    local_24 = iVar2 + AssetArtLandscape;
    local_28 = QModelIndex::row(param_2_local);
  }
  resourceSelected(this,local_24,local_28);
  return;
}

Assistant:

void
FSSMainWindow::onCurrentChanged(const QModelIndex &current,
                                const QModelIndex & /*previous*/) {
  Data::Resource resource_class = Data::AssetNone;
  unsigned int index = 0;

  if (current.parent().isValid()) {
    resource_class = (Data::Resource)(current.parent().row() + 1);
    index = current.row();
  }

  emit resourceSelected(resource_class, index);
}